

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

char * __thiscall mp::BasicConstraintKeeper::GetShortTypeName(BasicConstraintKeeper *this)

{
  bool bVar1;
  ulong uVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__lhs;
  reference pcVar3;
  char *pcVar4;
  long *in_RDI;
  char *c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  size_type colon_pos;
  unsigned_long word_end;
  string acc_opt;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__rhs;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  unsigned_long local_58;
  unsigned_long local_50;
  char *local_48;
  allocator<char> local_29;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28 [5];
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    (**(code **)(*in_RDI + 0xd8))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (allocator<char> *)in_stack_ffffffffffffff70._M_current);
    std::allocator<char>::~allocator(&local_29);
    __rhs = local_28;
    local_50 = std::__cxx11::string::find((char)__rhs,0x20);
    local_58 = std::__cxx11::string::size();
    __lhs = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::min<unsigned_long>(&local_50,&local_58);
    local_48 = __lhs->_M_current;
    std::__cxx11::string::find((char)local_28,0x3a);
    std::__cxx11::string::substr((ulong)&stack0xffffffffffffff80,(ulong)local_28);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x12),(string *)&stack0xffffffffffffff80);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(__lhs,__rhs), bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&stack0xffffffffffffff70);
      if (*pcVar3 == ':') {
        *pcVar3 = '_';
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&stack0xffffffffffffff70);
    }
    std::__cxx11::string::~string((string *)local_28);
  }
  pcVar4 = (char *)std::__cxx11::string::c_str();
  return pcVar4;
}

Assistant:

const char*
BasicConstraintKeeper::GetShortTypeName() const {
  if (type_name_short_.empty()) {
    std::string acc_opt = GetAcceptanceOptionNames();
    assert(acc_opt.size());
    auto word_end = std::min(acc_opt.find(' '),
                             acc_opt.size());
    auto colon_pos = acc_opt.find(':');
    if (colon_pos>word_end)
      colon_pos = 0;
    type_name_short_ = acc_opt.substr(
        colon_pos, word_end-colon_pos);
    for (auto& c: type_name_short_)
      if (':'==c)
        c = '_';                // Markdown
    assert(type_name_short_.size());
  }
  return type_name_short_.c_str();
}